

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

bool __thiscall ON_EmbeddedFile::LoadFromFile(ON_EmbeddedFile *this,wchar_t *filename)

{
  CImpl *this_00;
  bool bVar1;
  wchar_t *filename_00;
  ON_wString local_20;
  
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x21])();
  ON_FileSystemPath::CleanPath((ON_FileSystemPath *)&local_20,filename);
  ON_wString::operator=(&this->m_impl->m_orig_file,&local_20);
  ON_wString::~ON_wString(&local_20);
  bVar1 = ON_wString::IsEmpty(&this->m_impl->m_orig_file);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    this_00 = this->m_impl;
    filename_00 = ON_wString::operator_cast_to_wchar_t_(&this_00->m_orig_file);
    bVar1 = CImpl::LoadFile(this_00,filename_00);
  }
  return bVar1;
}

Assistant:

bool ON_EmbeddedFile::LoadFromFile(const wchar_t* filename)
{
  Clear();

  m_impl->m_orig_file = ON_FileSystemPath::CleanPath(filename);

  if (m_impl->m_orig_file.IsEmpty())
    return false;

  if (!m_impl->LoadFile(m_impl->m_orig_file))
    return false;

  return true;
}